

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O2

Status __thiscall mognetwork::TcpSocket::sendPendingDatas(TcpSocket *this)

{
  DataList *this_00;
  _List_node_base *p_Var1;
  void *pvVar2;
  _List_node_base *p_Var3;
  SocketFD __fd;
  Status SVar4;
  ssize_t sVar5;
  size_type sVar6;
  uint uVar7;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  this_00 = &this->m_pendingDatas;
  while( true ) {
    p_Var1 = (this_00->
             super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this_00) {
      return Nok;
    }
    __fd = Socket::getSocketFD(&this->super_Socket);
    pvVar2 = (p_Var1[1]._M_next)->_M_next;
    sVar5 = ::send(__fd,pvVar2,(long)(p_Var1[1]._M_next)->_M_prev - (long)pvVar2,0x4000);
    uVar7 = (uint)sVar5;
    if ((int)uVar7 < 0) {
      SVar4 = OsSocket::getErrorStatus();
      return SVar4;
    }
    if (uVar7 == 0) {
      return Disconnected;
    }
    p_Var3 = p_Var1[1]._M_next;
    sVar6 = (long)(((_Vector_impl *)&p_Var3->_M_prev)->super__Vector_impl_data)._M_start -
            (long)(((_Vector_impl *)&p_Var3->_M_next)->super__Vector_impl_data)._M_start;
    if ((uVar7 & 0x7fffffff) != sVar6) break;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)p_Var3);
    operator_delete(p_Var3);
    std::__cxx11::
    list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
    ::pop_front(this_00);
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)&local_48,sVar6,'\0');
  pvVar2 = (p_Var1[1]._M_next)->_M_next;
  memcpy(local_48._M_impl.super__Vector_impl_data._M_start,pvVar2,
         (long)(p_Var1[1]._M_next)->_M_prev - (long)pvVar2);
  p_Var3 = p_Var1[1]._M_next;
  sVar6 = (long)*(pointer *)
                 &((_Vector_base<char,_std::allocator<char>_> *)&p_Var3->_M_prev)->_M_impl -
          (long)((((_Vector_base<char,_std::allocator<char>_> *)&p_Var3->_M_next)->_M_impl).
                 super__Vector_impl_data._M_start + (uVar7 & 0x7fffffff));
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)p_Var3,sVar6,'\0');
  memcpy((p_Var1[1]._M_next)->_M_next,local_48._M_impl.super__Vector_impl_data._M_start,sVar6);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
  return Ok;
}

Assistant:

Socket::Status TcpSocket::sendPendingDatas()
  {
    //    m_mutex.lock();
    if (!m_pendingDatas.empty())
      {
	int sended;
	DataList::iterator it = m_pendingDatas.begin();
	sended = ::send(getSocketFD(), &(*it)->front(), (*it)->size(), flags);
	if (sended < 0) {
	  //	  m_mutex.unlock();
	  return (OsSocket::getErrorStatus());
	}
	if (sended == 0) {
	  //m_mutex.unlock();
	  return (Disconnected);
	}
	if ((std::size_t)sended == (*it)->size())
	  {
	    delete *it;
	    m_pendingDatas.pop_front();
	    //m_mutex.unlock();
	    return (sendPendingDatas());
	  }
	Data temp;
	temp.resize((*it)->size());
	std::memcpy(&temp[0], &(*it)->front(), (*it)->size());
	std::size_t waiting = (*it)->size() - sended;
	(*it)->resize(waiting);
	std::memcpy(&(*it)->front(), &temp[0], waiting);
	//	m_mutex.unlock();
	return (Ok);
      }
    //    m_mutex.unlock();
    return (Nok);
  }